

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
::int_writer<wchar_t,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  basic_string_view<wchar_t> sep;
  wchar_t *pwVar1;
  undefined8 *in_RSI;
  long in_RDI;
  wchar_t *unaff_retaddr;
  add_thousands_sep<wchar_t> in_stack_00000010;
  basic_string_view<wchar_t> s;
  add_thousands_sep<wchar_t> local_38;
  basic_string_view<wchar_t> local_20;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  basic_string_view<wchar_t>::basic_string_view(&local_20,(wchar_t *)(in_RDI + 8),1);
  sep.size_ = local_20.size_;
  sep.data_ = local_20.data_;
  internal::add_thousands_sep<wchar_t>::add_thousands_sep(&local_38,sep);
  pwVar1 = internal::
           format_decimal<wchar_t,unsigned_int,wchar_t*,fmt::v5::internal::add_thousands_sep<wchar_t>>
                     (unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),(int)in_RDI,in_stack_00000010);
  *local_10 = pwVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }